

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O0

int dom_cmp_name(char *name,IXML_Node *node)

{
  int iVar1;
  parse_status_t pVar2;
  char *__s2;
  size_t slen;
  int local_4c;
  undefined1 local_48 [4];
  int ret_code;
  memptr dummy;
  memptr nameptr;
  char *node_name;
  IXML_Node *node_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    __assert_fail("name",".upnp/src/soap/soap_ctrlpt.c",0x4d,
                  "int dom_cmp_name(const char *, IXML_Node *)");
  }
  if (node != (IXML_Node *)0x0) {
    __s2 = ixmlNode_getNodeName(node);
    if (__s2 == (char *)0x0) {
      name_local._4_4_ = -0x68;
    }
    else {
      iVar1 = strcmp(name,__s2);
      if (iVar1 == 0) {
        local_4c = 0;
      }
      else {
        slen = strlen(__s2);
        pVar2 = matchstr(__s2,slen,"%s:%s%0",local_48,&dummy.length);
        if ((pVar2 == PARSE_OK) && (iVar1 = strcmp((char *)dummy.length,name), iVar1 == 0)) {
          local_4c = 0;
        }
        else {
          local_4c = 1;
        }
      }
      name_local._4_4_ = local_4c;
    }
    return name_local._4_4_;
  }
  __assert_fail("node",".upnp/src/soap/soap_ctrlpt.c",0x4e,
                "int dom_cmp_name(const char *, IXML_Node *)");
}

Assistant:

static int dom_cmp_name(
	/* [in] lookup name. */
	const char *name,
	/* [in] xml node. */
	IXML_Node *node)
{
	const DOMString node_name = NULL;
	memptr nameptr;
	memptr dummy;
	int ret_code;

	assert(name);
	assert(node);

	node_name = ixmlNode_getNodeName(node);
	if (node_name == NULL)
		return UPNP_E_OUTOF_MEMORY;
	if (strcmp(name, node_name) == 0)
		ret_code = 0;
	else if (matchstr((char *)node_name,
			 strlen(node_name),
			 "%s:%s%0",
			 &dummy,
			 &nameptr) == PARSE_OK &&
		 strcmp(nameptr.buf, name) == 0)
		ret_code = 0;
	else
		/* names are not the same */
		ret_code = 1;

	return ret_code;
}